

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseSections
          (FfsParser *this,UByteArray *sections,UModelIndex *index,bool insertIntoTree)

{
  uchar **__return_storage_ptr__;
  int iVar1;
  bool bVar2;
  UINT8 UVar3;
  int32_t iVar4;
  UINT32 UVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  USTATUS errorCode;
  TreeModel *pTVar10;
  undefined1 local_238 [8];
  UModelIndex current;
  undefined1 local_218 [4];
  int i;
  CBString local_200;
  CBString local_1e8;
  UByteArray local_1d0;
  undefined1 local_1b0 [8];
  UModelIndex sectionIndex;
  UByteArray local_180;
  UByteArray local_160;
  CBString local_140;
  CBString local_128;
  undefined1 local_110 [8];
  UModelIndex dataIndex;
  CBString info;
  UByteArray padding;
  UINT32 sectionSize;
  VOLUME_PARSING_DATA *pdata;
  UByteArray data;
  UModelIndex parentVolumeIndex;
  UINT8 ffsVersion;
  USTATUS result;
  UINT32 sectionOffset;
  UByteArray local_58;
  int32_t local_34;
  uint local_30;
  UINT32 headerSize;
  UINT32 bodySize;
  bool insertIntoTree_local;
  UModelIndex *index_local;
  UByteArray *sections_local;
  FfsParser *this_local;
  
  headerSize._3_1_ = insertIntoTree;
  _bodySize = index;
  index_local = (UModelIndex *)sections;
  sections_local = (UByteArray *)this;
  bVar2 = UModelIndex::isValid(index);
  if (bVar2) {
    local_30 = UByteArray::size((UByteArray *)index_local);
    TreeModel::header(&local_58,this->model,_bodySize);
    iVar4 = UByteArray::size(&local_58);
    UByteArray::~UByteArray(&local_58);
    result._0_4_ = 0;
    parentVolumeIndex.m._7_1_ = '\x02';
    local_34 = iVar4;
    TreeModel::findParentOfType
              ((UModelIndex *)((long)&data.d.field_2 + 8),this->model,_bodySize,'A');
    bVar2 = UModelIndex::isValid((UModelIndex *)((long)&data.d.field_2 + 8));
    if ((bVar2) &&
       (bVar2 = TreeModel::hasEmptyParsingData
                          (this->model,(UModelIndex *)((long)&data.d.field_2 + 8)), !bVar2)) {
      TreeModel::parsingData
                ((UByteArray *)&pdata,this->model,(UModelIndex *)((long)&data.d.field_2 + 8));
      pcVar9 = UByteArray::constData((UByteArray *)&pdata);
      parentVolumeIndex.m._7_1_ = pcVar9[0x19];
      UByteArray::~UByteArray((UByteArray *)&pdata);
    }
    for (; (uint)result < local_30; result._0_4_ = UVar5 + (uint)result + 3 & 0xfffffffc) {
      UVar5 = getSectionSize(this,(UByteArray *)index_local,(uint)result,parentVolumeIndex.m._7_1_);
      if ((UVar5 < 4) || (local_30 - (uint)result < UVar5)) {
        if ((headerSize._3_1_ & 1) == 0) {
          return 0x14;
        }
        __return_storage_ptr__ = &info.super_tagbstring.data;
        UByteArray::mid((UByteArray *)__return_storage_ptr__,(UByteArray *)index_local,(uint)result,
                        -1);
        uVar6 = UByteArray::size((UByteArray *)__return_storage_ptr__);
        uVar7 = UByteArray::size((UByteArray *)&info.super_tagbstring.data);
        usprintf((CBString *)&dataIndex.m,"Full size: %Xh (%u)",(ulong)uVar6,(ulong)uVar7);
        pTVar10 = this->model;
        UVar5 = local_34 + (uint)result;
        Bstrlib::CBString::CBString(&local_128,"Non-UEFI data");
        Bstrlib::CBString::CBString(&local_140);
        UByteArray::UByteArray(&local_160);
        UByteArray::UByteArray(&local_180);
        TreeModel::addItem((UModelIndex *)local_110,pTVar10,UVar5,'@','z',&local_128,&local_140,
                           (CBString *)&dataIndex.m,&local_160,
                           (UByteArray *)&info.super_tagbstring.data,&local_180,Fixed,_bodySize,'\0'
                          );
        UByteArray::~UByteArray(&local_180);
        UByteArray::~UByteArray(&local_160);
        Bstrlib::CBString::~CBString(&local_140);
        Bstrlib::CBString::~CBString(&local_128);
        usprintf((CBString *)&sectionIndex.m,"%s: non-UEFI data found in sections area",
                 "parseSections");
        msg(this,(CBString *)&sectionIndex.m,(UModelIndex *)local_110);
        Bstrlib::CBString::~CBString((CBString *)&sectionIndex.m);
        Bstrlib::CBString::~CBString((CBString *)&dataIndex.m);
        UByteArray::~UByteArray((UByteArray *)&info.super_tagbstring.data);
        break;
      }
      UModelIndex::UModelIndex((UModelIndex *)local_1b0);
      UByteArray::mid(&local_1d0,(UByteArray *)index_local,(uint)result,UVar5);
      errorCode = parseSectionHeader(this,&local_1d0,local_34 + (uint)result,_bodySize,
                                     (UModelIndex *)local_1b0,(bool)(headerSize._3_1_ & 1));
      UByteArray::~UByteArray(&local_1d0);
      if (errorCode != 0) {
        if ((headerSize._3_1_ & 1) == 0) {
          return 0x14;
        }
        usprintf(&local_200,"%s: section header parsing failed with error ","parseSections");
        errorCodeToUString((CBString *)local_218,errorCode);
        Bstrlib::CBString::operator+(&local_1e8,&local_200,(CBString *)local_218);
        msg(this,&local_1e8,_bodySize);
        Bstrlib::CBString::~CBString(&local_1e8);
        Bstrlib::CBString::~CBString((CBString *)local_218);
        Bstrlib::CBString::~CBString(&local_200);
      }
    }
    for (current.m._4_4_ = 0; iVar1 = current.m._4_4_,
        iVar8 = TreeModel::rowCount(this->model,_bodySize), iVar1 < iVar8;
        current.m._4_4_ = current.m._4_4_ + 1) {
      pTVar10 = UModelIndex::model(_bodySize);
      TreeModel::index((TreeModel *)local_238,(char *)pTVar10,current.m._4_4_);
      UVar3 = TreeModel::type(this->model,(UModelIndex *)local_238);
      if (UVar3 != '@') {
        if (UVar3 != 'C') {
          return 9;
        }
        parseSectionBody(this,(UModelIndex *)local_238);
      }
    }
    this_local = (FfsParser *)0x0;
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseSections(const UByteArray & sections, const UModelIndex & index, const bool insertIntoTree)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Search for and parse all sections
    UINT32 bodySize = (UINT32)sections.size();
    UINT32 headerSize = (UINT32)model->header(index).size();
    UINT32 sectionOffset = 0;
    USTATUS result = U_SUCCESS;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(index, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Iterate over sections
    UINT32 sectionSize = 0;
    while (sectionOffset < bodySize) {
        // Get section size
        sectionSize = getSectionSize(sections, sectionOffset, ffsVersion);
        
        // Check section size to be sane
        if (sectionSize < sizeof(EFI_COMMON_SECTION_HEADER)
            || sectionSize > (bodySize - sectionOffset)) {
            // Final parsing
            if (insertIntoTree) {
                // Add padding to fill the rest of sections
                UByteArray padding = sections.mid(sectionOffset);
                
                // Get info
                UString info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
                
                // Add tree item
                UModelIndex dataIndex = model->addItem(headerSize + sectionOffset, Types::Padding, Subtypes::DataPadding, UString("Non-UEFI data"), UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
                
                // Show message
                msg(usprintf("%s: non-UEFI data found in sections area", __FUNCTION__), dataIndex);
                
                // Exit from parsing loop
                break;
            }
            // Preliminary parsing
            else {
                return U_INVALID_SECTION;
            }
        }
        
        // Parse section header
        UModelIndex sectionIndex;
        result = parseSectionHeader(sections.mid(sectionOffset, sectionSize), headerSize + sectionOffset, index, sectionIndex, insertIntoTree);
        if (result) {
            if (insertIntoTree)
                msg(usprintf("%s: section header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            else
                return U_INVALID_SECTION;
        }
        
        // Move to next section
        sectionOffset += sectionSize;
        // TODO: verify that alignment bytes are actually zero as per PI spec
        sectionOffset = ALIGN4(sectionOffset);
    }
    
#if 0 // Do not enable this in production for now, as it needs further investigation.
    // The PI spec requires sections to be aligned by 4 byte boundary with bytes that are all exactly zeroes
    // Some images interpret "must be aligned by 4" as "every section needs to be padded for sectionSize to be divisible by 4".
    // Detecting this case can be done by checking for the very last section to have sectionSize not divisible by 4, while the total bodySize is.
    // However, such detection for a single file is unreliable because in 1/4 random cases the last section will be divisible by 4.
    // We also know that either PEI core or DXE core is entity that does file and section parsing,
    // so every single file in the volume should behave consistently.
    // This makes the probability of unsuccessful detection here to be 1/(4^numFilesInVolume),
    // which is low enough for real images out there.
    // It should also be noted that enabling this section alignment quirk for an image that doesn't require it
    // will not make the image unbootable, but will waste some space and possibly require to move some files around
    if (sectionOffset == bodySize) {
        // We are now at the very end of the file body, and sectionSize is the size of the last section
        if ((sectionSize % 4 != 0) // sectionSize of the very last section is not divisible by 4
            && (bodySize % 4 == 0)) { // yet bodySize is, meaning that there are indeed some padding bytes added after the last section
            msg(usprintf("%s: section alignment quirk found", __FUNCTION__), index);
        }
    }
#endif
    
    // Parse bodies, will be skipped if insertIntoTree is not required
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::Section:
                parseSectionBody(current);
                break;
            case Types::Padding:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}